

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

char * fmt::v7::detail::
       parse_replacement_field<char,fmt::v7::detail::format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,char>,char,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>&>
                 (char *begin,char *end,
                 format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                 *handler)

{
  undefined1 value [16];
  undefined1 value_00 [16];
  buffer_appender<char> out;
  buffer_appender<char> out_00;
  handle handle;
  uint uVar1;
  error_handler *begin_00;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> out_01;
  int in_ECX;
  error_handler *this;
  unkbyte10 in_stack_ffffffffffffff68;
  undefined6 in_stack_ffffffffffffff72;
  undefined1 local_88 [8];
  id_adapter<fmt::v7::detail::format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_&,_char>
  adapter;
  undefined1 auStack_58 [8];
  format_arg arg;
  
  begin_00 = (error_handler *)(begin + 1);
  if (begin_00 == (error_handler *)end) {
    error_handler::on_error((error_handler *)begin,"invalid format string");
  }
  if (*begin_00 == (error_handler)0x7b) {
    format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::on_text(handler,(char *)begin_00,begin + 2);
    goto LAB_0020db83;
  }
  if (*begin_00 == (error_handler)0x7d) {
    uVar1 = basic_format_parse_context<char,_fmt::v7::detail::error_handler>::next_arg_id
                      (&handler->parse_context);
    get_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>,int>
              ((format_arg *)auStack_58,(detail *)&handler->context,
               (basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *)(ulong)uVar1,
               in_ECX);
    out_01.container =
         (handler->context).out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
         container;
    adapter._8_8_ = out_01.container;
    switch(arg.value_.field_0.int128_value._8_4_) {
    case 1:
switchD_0020d9ac_caseD_1:
      adapter._8_8_ = out_01.container;
      out_01.container =
           (buffer<char> *)
           write<char,_fmt::v7::detail::buffer_appender<char>,_int,_0>
                     (out_01.container,auStack_58._0_4_);
      break;
    case 2:
switchD_0020d9ac_caseD_2:
      adapter._8_8_ = out_01.container;
      out_01.container =
           (buffer<char> *)
           write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned_int,_0>
                     (out_01.container,auStack_58._0_4_);
      break;
    case 3:
switchD_0020d9ac_caseD_3:
      adapter._8_8_ = out_01.container;
      out_01.container =
           (buffer<char> *)
           write<char,_fmt::v7::detail::buffer_appender<char>,_long_long,_0>
                     (out_01.container,CONCAT44(auStack_58._4_4_,auStack_58._0_4_));
      break;
    case 4:
switchD_0020d9ac_caseD_4:
      adapter._8_8_ = out_01.container;
      out_01.container =
           (buffer<char> *)
           write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned_long_long,_0>
                     (out_01.container,CONCAT44(auStack_58._4_4_,auStack_58._0_4_));
      break;
    case 5:
switchD_0020d9ac_caseD_5:
      out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container._4_4_ =
           auStack_58._4_4_;
      out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container._0_4_ =
           auStack_58._0_4_;
      value._10_6_ = in_stack_ffffffffffffff72;
      value._0_10_ = in_stack_ffffffffffffff68;
      adapter._8_8_ = out_01.container;
      out_01.container =
           (buffer<char> *)
           write<char,_fmt::v7::detail::buffer_appender<char>,___int128,_0>
                     (out_01.container,out,(__int128)value);
      break;
    case 6:
switchD_0020d9ac_caseD_6:
      out_00.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container._4_4_ =
           auStack_58._4_4_;
      out_00.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container._0_4_ =
           auStack_58._0_4_;
      value_00._10_6_ = in_stack_ffffffffffffff72;
      value_00._0_10_ = in_stack_ffffffffffffff68;
      adapter._8_8_ = out_01.container;
      out_01.container =
           (buffer<char> *)
           write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned___int128,_0>
                     (out_01.container,out_00,(unsigned___int128)value_00);
      break;
    case 7:
switchD_0020d9ac_caseD_7:
      adapter._8_8_ = out_01.container;
      out_01.container =
           (buffer<char> *)
           write<char,fmt::v7::detail::buffer_appender<char>>(out_01.container,(bool)auStack_58[0]);
      break;
    case 8:
switchD_0020d9ac_caseD_8:
      adapter._8_8_ = out_01.container;
      out_01.container =
           (buffer<char> *)
           write<char,fmt::v7::detail::buffer_appender<char>>(out_01.container,auStack_58[0]);
      break;
    case 9:
switchD_0020d9ac_caseD_9:
      adapter._8_8_ = out_01.container;
      out_01.container =
           (buffer<char> *)
           write<char,_fmt::v7::detail::buffer_appender<char>,_float,_0>
                     (out_01.container,(float)auStack_58._0_4_);
      break;
    case 10:
switchD_0020d9ac_caseD_a:
      adapter._8_8_ = out_01.container;
      out_01.container =
           (buffer<char> *)
           write<char,_fmt::v7::detail::buffer_appender<char>,_double,_0>
                     (out_01.container,(double)CONCAT44(auStack_58._4_4_,auStack_58._0_4_));
      break;
    case 0xb:
switchD_0020d9ac_caseD_b:
      adapter._8_8_ = out_01.container;
      out_01.container =
           (buffer<char> *)
           write<char,_fmt::v7::detail::buffer_appender<char>,_long_double,_0>
                     (out_01.container,
                      (longdouble)
                      CONCAT28(arg.value_.field_0.int_value._0_2_,
                               CONCAT44(auStack_58._4_4_,auStack_58._0_4_)));
      break;
    case 0xc:
switchD_0020d9ac_caseD_c:
      adapter._8_8_ = out_01.container;
      out_01.container =
           (buffer<char> *)
           write<char,fmt::v7::detail::buffer_appender<char>>
                     (out_01.container,(char *)CONCAT44(auStack_58._4_4_,auStack_58._0_4_));
      break;
    case 0xd:
switchD_0020d9ac_caseD_d:
      adapter._8_8_ = out_01.container;
      buffer<char>::append<char>
                (out_01.container,(char *)CONCAT44(auStack_58._4_4_,auStack_58._0_4_),
                 (char *)CONCAT44(auStack_58._4_4_,auStack_58._0_4_) +
                 CONCAT62(arg.value_.field_0.long_long_value._2_6_,
                          arg.value_.field_0.int_value._0_2_));
      break;
    case 0xe:
switchD_0020d9ac_caseD_e:
      adapter._8_8_ = out_01.container;
      out_01.container =
           (buffer<char> *)
           write<char,fmt::v7::detail::buffer_appender<char>>
                     (out_01.container,(void *)CONCAT44(auStack_58._4_4_,auStack_58._0_4_));
      break;
    case 0xf:
switchD_0020d9ac_caseD_f:
      handle.custom_.value._4_4_ = auStack_58._4_4_;
      handle.custom_.value._0_4_ = auStack_58._0_4_;
      handle.custom_.format._0_2_ = arg.value_.field_0.int_value._0_2_;
      handle.custom_.format._2_6_ = arg.value_.field_0.long_long_value._2_6_;
      out_01.container =
           (buffer<char> *)
           default_arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>::operator()
                     ((default_arg_formatter<fmt::v7::detail::buffer_appender<char>,_char> *)
                      &adapter.arg_id,handle);
      break;
    default:
switchD_0020d9ac_default:
      adapter._8_8_ = out_01.container;
      out_01.container =
           (buffer<char> *)write<char,fmt::v7::detail::buffer_appender<char>>(out_01.container);
    }
    (handler->context).out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
         out_01.container;
LAB_0020db83:
    return (char *)(begin_00 + 1);
  }
  adapter.handler._0_4_ = 0;
  this = begin_00;
  local_88 = (undefined1  [8])handler;
  begin_00 = (error_handler *)
             parse_arg_id<char,fmt::v7::detail::id_adapter<fmt::v7::detail::format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,char>,char,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>&,char>&>
                       ((char *)begin_00,end,
                        (id_adapter<fmt::v7::detail::format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_&,_char>
                         *)local_88);
  if (begin_00 == (error_handler *)end) {
LAB_0020dba4:
    error_handler::on_error(this,"missing \'}\' in format string");
  }
  if (*begin_00 == (error_handler)0x3a) {
    begin_00 = (error_handler *)
               format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
               ::on_format_specs(handler,(uint)adapter.handler,(char *)(begin_00 + 1),end);
    if ((begin_00 == (error_handler *)end) || (*begin_00 != (error_handler)0x7d)) {
      error_handler::on_error((error_handler *)handler,"unknown format specifier");
    }
    goto LAB_0020db83;
  }
  if (*begin_00 != (error_handler)0x7d) goto LAB_0020dba4;
  get_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>,int>
            ((format_arg *)auStack_58,(detail *)&handler->context,
             (basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *)
             (ulong)(uint)adapter.handler,in_ECX);
  out_01.container =
       (handler->context).out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  adapter._8_8_ = out_01.container;
  switch(arg.value_.field_0.int128_value._8_4_) {
  case 1:
    goto switchD_0020d9ac_caseD_1;
  case 2:
    goto switchD_0020d9ac_caseD_2;
  case 3:
    goto switchD_0020d9ac_caseD_3;
  case 4:
    goto switchD_0020d9ac_caseD_4;
  case 5:
    goto switchD_0020d9ac_caseD_5;
  case 6:
    goto switchD_0020d9ac_caseD_6;
  case 7:
    goto switchD_0020d9ac_caseD_7;
  case 8:
    goto switchD_0020d9ac_caseD_8;
  case 9:
    goto switchD_0020d9ac_caseD_9;
  case 10:
    goto switchD_0020d9ac_caseD_a;
  case 0xb:
    goto switchD_0020d9ac_caseD_b;
  case 0xc:
    goto switchD_0020d9ac_caseD_c;
  case 0xd:
    goto switchD_0020d9ac_caseD_d;
  case 0xe:
    goto switchD_0020d9ac_caseD_e;
  case 0xf:
    goto switchD_0020d9ac_caseD_f;
  default:
    goto switchD_0020d9ac_default;
  }
}

Assistant:

FMT_CONSTEXPR const Char* parse_replacement_field(const Char* begin,
                                                  const Char* end,
                                                  Handler&& handler) {
  ++begin;
  if (begin == end) return handler.on_error("invalid format string"), end;
  if (static_cast<char>(*begin) == '}') {
    handler.on_replacement_field(handler.on_arg_id(), begin);
  } else if (*begin == '{') {
    handler.on_text(begin, begin + 1);
  } else {
    auto adapter = id_adapter<Handler, Char>{handler, 0};
    begin = parse_arg_id(begin, end, adapter);
    Char c = begin != end ? *begin : Char();
    if (c == '}') {
      handler.on_replacement_field(adapter.arg_id, begin);
    } else if (c == ':') {
      begin = handler.on_format_specs(adapter.arg_id, begin + 1, end);
      if (begin == end || *begin != '}')
        return handler.on_error("unknown format specifier"), end;
    } else {
      return handler.on_error("missing '}' in format string"), end;
    }
  }
  return begin + 1;
}